

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O1

bool pg::pm_less(int *a,int *b,int k,int pl)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  bVar6 = 0 < k;
  if (0 < k) {
    uVar4 = *a;
    uVar5 = *b;
    if (uVar4 == uVar5) {
      uVar1 = (ulong)(uint)k;
      uVar2 = 1;
      do {
        uVar3 = uVar2;
        if (uVar1 == uVar3) {
          bVar6 = uVar3 < uVar1;
          goto LAB_00172645;
        }
        uVar4 = a[uVar3];
        uVar5 = b[uVar3];
        uVar2 = uVar3 + 1;
      } while (uVar4 == uVar5);
      bVar6 = uVar3 < uVar1;
    }
    if (uVar4 == 0xffffffff) {
      pl = 1;
    }
    else if (uVar5 == 0xffffffff) {
      pl = 0;
    }
    else if ((uVar4 & 1) == pl) {
      pl = (int)((int)uVar4 < (int)uVar5 && (uVar5 & 1) == pl);
    }
    else {
      pl = (int)((int)uVar5 < (int)uVar4 || (uVar5 & 1) == pl);
    }
  }
LAB_00172645:
  return (bool)(bVar6 & (byte)pl);
}

Assistant:

static bool
pm_less(int* a, int* b, int k, int pl)
{
    // remember: _ < 5 < 3 < 1 < 0 < 2 < 4 < 6 (even measures, solving for odd)
    // remember: _ < 6 < 4 < 2 < 0 < 1 < 3 < 5 (odd measures, solving for even)

    for (int i=0; i<k; i++) {
        // if equal, then continue with next
        if (a[i] == b[i]) continue;
        // cases where a[i] is _ or b[i] is _
        if (a[i] == -1) return true;
        if (b[i] == -1) return false;
        // case distinction based on parity
        const bool a_is_pl = (a[i]&1) == pl;
        const bool b_is_pl = (b[i]&1) == pl;
        if (a_is_pl) {
            if (b_is_pl) return a[i] < b[i];
            else return false;
        } else {
            if (b_is_pl) return true;
            else return a[i] > b[i];
        }
    }
    // they are equal, so not less...
    return false;
}